

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getTagFromName
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Name name)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Tag *pTVar3;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  Err local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar5 = name.super_IString.str._M_str;
  pTVar3 = Module::getTagOrNull(this->wasm,name);
  if (pTVar3 == (Tag *)0x0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pcVar5,pcVar5 + name.super_IString.str._M_len);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0xe2a123);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = plVar4[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Lexer::err(&local_b0,&this->in,&local_90);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err> = puVar1;
    paVar2 = &local_b0.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_b0.msg.field_2._M_allocated_capacity._1_7_,
                         local_b0.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x18) =
           local_b0.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> = local_b0.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                        super__Move_assign_alias<wasm::Name,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10) =
           CONCAT71(local_b0.msg.field_2._M_allocated_capacity._1_7_,
                    local_b0.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) =
         local_b0.msg._M_string_length;
    local_b0.msg._M_string_length = 0;
    local_b0.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\x01';
    local_b0.msg._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    *(size_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err> = name.super_IString.str._M_len;
    *(char **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = pcVar5;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getTagFromName(Name name) {
    if (!wasm.getTagOrNull(name)) {
      return in.err("tag $" + name.toString() + " does not exist");
    }
    return name;
  }